

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O0

void __thiscall CSocekt::inMsgRecvQueue(CSocekt *this,char *buf,int *imrqc)

{
  SourceFile file;
  int iVar1;
  LogLevel LVar2;
  int *in_RDX;
  SourceFile *in_RDI;
  MutexLockGuard lock;
  undefined4 in_stack_ffffffffffffefc8;
  int in_stack_ffffffffffffefcc;
  Logger *in_stack_ffffffffffffefd0;
  undefined4 in_stack_ffffffffffffefd8;
  undefined4 in_stack_ffffffffffffefdc;
  Logger *in_stack_fffffffffffff000;
  
  muduo::MutexLockGuard::MutexLockGuard
            ((MutexLockGuard *)in_stack_ffffffffffffefd0,
             (MutexLock *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8));
  std::__cxx11::list<char_*,_std::allocator<char_*>_>::push_back
            ((list<char_*,_std::allocator<char_*>_> *)in_RDI,
             (value_type *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
  muduo::detail::AtomicIntegerT<int>::increment((AtomicIntegerT<int> *)0x140b36);
  iVar1 = muduo::detail::AtomicIntegerT<int>::get((AtomicIntegerT<int> *)(in_RDI + 3));
  *in_RDX = iVar1;
  LVar2 = muduo::Logger::logLevel();
  if ((int)LVar2 < 3) {
    muduo::Logger::SourceFile::SourceFile<108>(in_RDI,(char (*) [108])CONCAT44(iVar1,LVar2));
    file.data_._4_4_ = iVar1;
    file.data_._0_4_ = LVar2;
    file._8_8_ = in_RDI;
    muduo::Logger::Logger(in_stack_ffffffffffffefd0,file,in_stack_ffffffffffffefcc);
    muduo::Logger::stream((Logger *)&stack0xffffffffffffeff8);
    muduo::LogStream::operator<<((LogStream *)in_RDI,(char *)CONCAT44(iVar1,LVar2));
    muduo::Logger::~Logger(in_stack_fffffffffffff000);
  }
  muduo::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x140c12);
  return;
}

Assistant:

void CSocekt::inMsgRecvQueue(char *buf, int &imrqc) //buf这段内存 ： 消息头 + 包头 + 包体
{
    muduo::MutexLockGuard lock(m_recvMessageQueueMutex);
    m_MsgRecvQueue.push_back(buf);

    m_iRecvMsgQueueCount.increment();

    imrqc = m_iRecvMsgQueueCount.get();
    
    //....其他功能待扩充，这里要记住一点，这里的内存都是要释放的，否则。。。。。。。。。。日后增加释放这些内存的代码
    //...而且逻辑处理应该要引入多线程，所以这里要考虑临界问题
    //....

    //临时在这里调用一下该函数，以防止接收消息队列过大
//    tmpoutMsgRecvQueue();   //.....临时，后续会取消这行代码

    //为了测试方便，因为本函数意味着收到了一个完整的数据包，所以这里打印一个信息
    LOG_INFO << "非常好，收到了一个完整的数据包【包头+包体】！";
}